

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void sha512_init(sha512 *ctx)

{
  ctx->fill = 0;
  ctx->count = 0;
  ctx->state[0] = 0x6a09e667f3bcc908;
  ctx->state[1] = 0xbb67ae8584caa73b;
  ctx->state[2] = 0x3c6ef372fe94f82b;
  ctx->state[3] = 0xa54ff53a5f1d36f1;
  ctx->state[4] = 0x510e527fade682d1;
  ctx->state[5] = 0x9b05688c2b3e6c1f;
  ctx->state[6] = 0x1f83d9abfb41bd6b;
  ctx->state[7] = 0x5be0cd19137e2179;
  return;
}

Assistant:

void
sha512_init(struct sha512 *ctx)
{
	ctx->fill = 0;
	ctx->count = 0;

	ctx->state[0] = 0x6a09e667f3bcc908ULL;
	ctx->state[1] = 0xbb67ae8584caa73bULL;
	ctx->state[2] = 0x3c6ef372fe94f82bULL;
	ctx->state[3] = 0xa54ff53a5f1d36f1ULL;
	ctx->state[4] = 0x510e527fade682d1ULL;
	ctx->state[5] = 0x9b05688c2b3e6c1fULL;
	ctx->state[6] = 0x1f83d9abfb41bd6bULL;
	ctx->state[7] = 0x5be0cd19137e2179ULL;
}